

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall minja::Context::get(Value *__return_storage_ptr__,Context *this,Value *key)

{
  element_type *peVar1;
  bool bVar2;
  Value *pVVar3;
  
  bVar2 = Value::contains(&this->values_,key);
  if (bVar2) {
    pVVar3 = Value::at(&this->values_,key);
    Value::Value(__return_storage_ptr__,pVVar3);
  }
  else {
    peVar1 = (this->parent_).super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      Value::Value(__return_storage_ptr__);
    }
    else {
      (*peVar1->_vptr_Context[2])(__return_storage_ptr__,peVar1,key);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual Value get(const Value & key) {
        if (values_.contains(key)) return values_.at(key);
        if (parent_) return parent_->get(key);
        return Value();
    }